

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rifiuti-vista.c
# Opt level: O2

int main(int argc,char **argv)

{
  metarecord *pmVar1;
  _Bool _Var2;
  GQuark GVar3;
  int iVar4;
  GQuark GVar5;
  exitcode eVar6;
  undefined8 uVar7;
  GError *pGVar8;
  char *pcVar9;
  GPtrArray *pGVar10;
  GError *error;
  char **argv_local;
  
  error = (GError *)0x0;
  argv_local = argv;
  _Var2 = rifiuti_init(RECYCLE_BIN_TYPE_DIR,"DIR_OR_FILE",
                       "Parse index files in C:\\$Recycle.bin style folder and dump recycle bin data.  Can also dump a single index file."
                       ,&argv_local,&error);
  if (!_Var2) goto LAB_00103986;
  do_parse_records(_parse_record_cb);
  pGVar10 = meta->records;
  if (pGVar10->len == 0) {
    iVar4 = g_hash_table_size(meta->invalid_records);
    if (iVar4 == 0) {
      pGVar10 = meta->records;
      goto LAB_001038ae;
    }
    GVar3 = rifiuti_fatal_error_quark();
    pcVar9 = "No valid recycle bin record found";
LAB_00103919:
    uVar7 = dcgettext(0,pcVar9,5);
    g_set_error_literal(&error,GVar3,1,uVar7);
  }
  else {
LAB_001038ae:
    g_ptr_array_sort(pGVar10,_sort_record_by_time);
    pmVar1 = meta;
    pGVar10 = meta->records;
    if (pGVar10->len == 0) {
      meta->version = -1;
    }
    else {
      meta->version = **pGVar10->pdata;
      g_ptr_array_foreach(pGVar10,_compare_idx_versions,pmVar1);
      if (pmVar1->version == -2) {
        GVar3 = rifiuti_fatal_error_quark();
        pcVar9 = 
        "Index files from multiple Windows versions are mixed together.  Please check each file individually."
        ;
        goto LAB_00103919;
      }
    }
    _Var2 = dump_content(&error);
    if (!_Var2) {
      GVar3 = error->domain;
      GVar5 = g_file_error_quark();
      if (GVar3 != GVar5) {
        g_assertion_message_expr
                  ("rifiuti2",
                   "/workspace/llm4binary/github/license_c_cmakelists/abelcheung[P]rifiuti2/src/rifiuti-vista.c"
                   ,0x15e,"main","error->domain == G_FILE_ERROR");
      }
      GVar3 = rifiuti_fatal_error_quark();
      uVar7 = g_strdup(error->message);
      pGVar8 = (GError *)g_error_new_literal(GVar3,2,uVar7);
      g_error_free(error);
      error = pGVar8;
    }
  }
LAB_00103986:
  eVar6 = rifiuti_cleanup(&error);
  return eVar6;
}

Assistant:

int
main (int    argc,
      char **argv)
{
    GError *error = NULL;

    UNUSED (argc);

    if (! rifiuti_init (
        RECYCLE_BIN_TYPE_DIR,
        N_("DIR_OR_FILE"),
        N_("Parse index files in C:\\$Recycle.bin style "
           "folder and dump recycle bin data.  "
           "Can also dump a single index file."),
        &argv, &error
    ))
        goto cleanup;

    do_parse_records (&_parse_record_cb);

    if (! meta->records->len && g_hash_table_size (meta->invalid_records))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("No valid recycle bin record found"));
        goto cleanup;
    }

    g_ptr_array_sort (meta->records, _sort_record_by_time);
    if (! _set_overall_rbin_version (meta))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("Index files from multiple Windows versions are mixed together."
            "  Please check each file individually."));
        goto cleanup;
    }

    if (! dump_content (&error))
    {
        g_assert (error->domain == G_FILE_ERROR);
        GError *new_err = g_error_new_literal (
            R2_FATAL_ERROR, R2_FATAL_ERROR_TEMPFILE,
            g_strdup (error->message));
        g_error_free (error);
        error = new_err;
    }

    cleanup:

    return rifiuti_cleanup (&error);
}